

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsubx.c
# Opt level: O1

MATRIX mat_submat(MATRIX A,int i,int j)

{
  int iVar1;
  int iVar2;
  MATRIX ppdVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  ppdVar3 = mat_creat(*(int *)(A + -1) + -1,*(int *)((long)A + -4) + -1,-1);
  iVar1 = *(int *)(A + -1);
  if (0 < (long)iVar1) {
    uVar4 = 0;
    iVar5 = 0;
    do {
      if (uVar4 != (uint)i) {
        iVar2 = *(int *)((long)A + -4);
        if (0 < (long)iVar2) {
          uVar6 = 0;
          iVar7 = 0;
          do {
            if ((uint)j != uVar6) {
              ppdVar3[iVar5][iVar7] = A[uVar4][uVar6];
              iVar7 = iVar7 + 1;
            }
            uVar6 = uVar6 + 1;
          } while ((long)iVar2 != uVar6);
        }
        iVar5 = iVar5 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (long)iVar1);
  }
  return ppdVar3;
}

Assistant:

MATRIX mat_submat( MATRIX A, int i, int j )
{
	int	m, m1, p, p1;
	MATRIX	S;

	S = mat_creat(MatRow(A)-1, MatCol(A)-1, UNDEFINED);

	for (m=m1=0; m<MatRow(A); m++)
		{
		if (m==i) continue;
		for (p=p1=0; p<MatCol(A); p++)
			{
			if (p==j) continue;
			S[m1][p1] = A[m][p];
			p1++;
			}
		m1++;
		}

	return (S);
}